

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

void YCbCrToRGBMCU(Header *header,MCU *mcu,MCU *cbcr,uint v,uint h)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar6;
  int *piVar7;
  uint x;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  piVar5 = (mcu->field_0).y + 0x3f;
  uVar6 = 7;
  do {
    uVar8 = 7;
    piVar7 = piVar5;
    do {
      fVar9 = (float)*piVar7;
      uVar3 = (ulong)(v * 0x20 + h * 4 +
                      (int)((uVar6 & 0xffffffff) / (ulong)header->verticalSamplingFactor) * 8 +
                     (uint)(byte)(((ushort)uVar8 & 0xff) / (ushort)header->horizontalSamplingFactor)
                     );
      fVar10 = (float)*(int *)((long)&cbcr->field_2 + uVar3 * 4);
      iVar1 = (int)(fVar10 * 1.402 + fVar9 + 128.0);
      fVar11 = (float)*(int *)((long)&cbcr->field_1 + uVar3 * 4);
      iVar2 = (int)(fVar10 * -0.714 + fVar11 * -0.344 + fVar9 + 128.0);
      iVar4 = (int)(fVar11 * 1.772 + fVar9 + 128.0);
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      if (0xfe < iVar1) {
        iVar1 = 0xff;
      }
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      if (0xfe < iVar2) {
        iVar2 = 0xff;
      }
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      if (0xfe < iVar4) {
        iVar4 = 0xff;
      }
      *piVar7 = iVar1;
      piVar7[0x40] = iVar2;
      piVar7[0x80] = iVar4;
      uVar8 = uVar8 - 1;
      piVar7 = piVar7 + -1;
    } while (uVar8 < 8);
    uVar6 = uVar6 - 1;
    piVar5 = piVar5 + -8;
  } while (uVar6 < 8);
  return;
}

Assistant:

void YCbCrToRGBMCU(const Header* const header, MCU& mcu, const MCU& cbcr, const uint v, const uint h) {
	//从bottom-right to top-left
	for (uint y = 7; y < 8; y--) {
		for (uint x = 7; x < 8; x--) {
			//chroma 分量用了第一个block的
			//luminance 分量不变
			const uint pixel = y * 8 + x;
			const uint cbcrPixelRow = y / header->verticalSamplingFactor + 4 * v;
			const uint cbcrPixelColumn = x / header->horizontalSamplingFactor + 4 * h;
			const uint cbcrPixel = cbcrPixelRow * 8 + cbcrPixelColumn;
			int r = mcu.y[pixel]  						       + 1.402f * cbcr.cr[cbcrPixel] + 128;
			int g = mcu.y[pixel] - 0.344f * cbcr.cb[cbcrPixel] - 0.714f * cbcr.cr[cbcrPixel] + 128;
			int b = mcu.y[pixel] + 1.772f * cbcr.cb[cbcrPixel] 							     + 128;
			r = r < 0 ? 0 : r;
			r = r > 255 ? 255 : r;
			g = g < 0 ? 0 : g;
			g = g > 255 ? 255 : g;
			b = b < 0 ? 0 : b;
			b = b > 255 ? 255 : b;
			mcu.r[pixel] = r;
			mcu.g[pixel] = g;
			mcu.b[pixel] = b;
		}
	}
	

}